

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

bool testing::TestSuite::TestPassed(TestInfo *test_info)

{
  bool bVar1;
  
  if (test_info->should_run_ == true) {
    bVar1 = TestResult::Skipped(&test_info->result_);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = TestResult::Failed(&test_info->result_);
      bVar1 = !bVar1;
    }
    return bVar1;
  }
  return false;
}

Assistant:

static bool TestPassed(const TestInfo* test_info) {
    return test_info->should_run() && test_info->result()->Passed();
  }